

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<bool>
          (AsciiParser *this,char sep,char end_symbol,vector<bool,_std::allocator<bool>_> *result)

{
  StreamReader *pSVar1;
  bool bVar2;
  ulong uVar3;
  char cVar4;
  bool value;
  char c;
  bool local_51;
  string local_50;
  
  (result->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p =
       (result->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_p;
  (result->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  bVar2 = SkipWhitespaceAndNewline(this,true);
  if (bVar2) {
    bVar2 = ReadBasicType(this,&local_51);
    if (bVar2) {
      ::std::vector<bool,_std::allocator<bool>_>::push_back(result,local_51);
    }
    else {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Not starting with the value of requested type.\n","");
      PushError(this,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    if (bVar2) {
      do {
        pSVar1 = this->_sr;
        if ((pSVar1->length_ <= pSVar1->idx_) || (pSVar1->binary_[pSVar1->idx_] == '\0'))
        goto LAB_0038f217;
        bVar2 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar2) {
          return false;
        }
        bVar2 = Char1(this,(char *)&local_50);
        cVar4 = '\x01';
        if (bVar2) {
          if ((char)local_50._M_dataplus._M_p == sep) {
            bVar2 = SkipCommentAndWhitespaceAndNewline(this,true);
            if (bVar2) {
              bVar2 = LookChar1(this,&local_51);
              cVar4 = (local_51 == (bool)end_symbol) * '\x03';
              if (!bVar2) {
                cVar4 = '\x01';
              }
              if (local_51 != (bool)end_symbol && bVar2) goto LAB_0038f1a2;
            }
          }
          else {
LAB_0038f1a2:
            if ((char)local_50._M_dataplus._M_p == sep) {
              cVar4 = '\x01';
              bVar2 = SkipWhitespaceAndNewline(this,true);
              if (bVar2) {
                bVar2 = ReadBasicType(this,&local_51);
                cVar4 = '\x03';
                if (bVar2) {
                  ::std::vector<bool,_std::allocator<bool>_>::push_back(result,local_51);
                  cVar4 = '\0';
                }
              }
            }
            else {
              pSVar1 = this->_sr;
              cVar4 = '\x03';
              if ((0 < (long)pSVar1->idx_) && (uVar3 = pSVar1->idx_ - 1, uVar3 <= pSVar1->length_))
              {
                pSVar1->idx_ = uVar3;
              }
            }
          }
        }
      } while (cVar4 == '\0');
      if (cVar4 != '\x01') {
LAB_0038f217:
        if ((result->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p !=
            (result->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_p) {
          return true;
        }
        if ((result->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_offset != 0) {
          return true;
        }
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Empty array.\n","");
        PushError(this,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}